

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar * __thiscall
icu_63::Normalizer2Impl::decomposeShort
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool stopAtCompBoundary,
          UBool onlyContiguous,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UChar UVar1;
  uint16_t norm16;
  UBool UVar2;
  int iVar3;
  UCPTrie *trie;
  uint c;
  UChar *pUVar4;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    do {
      if (limit <= src) {
        return src;
      }
      UVar1 = *src;
      if ((stopAtCompBoundary != '\0') && ((ushort)UVar1 < (ushort)this->minCompNoMaybeCP)) {
        return src;
      }
      c = (uint)(ushort)UVar1;
      pUVar4 = src + 1;
      if ((c & 0xf800) == 0xd800) {
        if ((pUVar4 == limit || ((byte)((ushort)UVar1 >> 10) & 1) != 0) ||
           (UVar1 = *pUVar4, ((ushort)UVar1 & 0xfc00) != 0xdc00)) {
          trie = this->normTrie;
          iVar3 = trie->dataLength + -1;
        }
        else {
          pUVar4 = src + 2;
          c = c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
          trie = this->normTrie;
          if ((int)c < trie->highStart) {
            iVar3 = ucptrie_internalSmallIndex_63(trie,c);
            trie = this->normTrie;
          }
          else {
            iVar3 = trie->dataLength + -2;
          }
        }
      }
      else {
        trie = this->normTrie;
        iVar3 = (c & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
      }
      norm16 = *(uint16_t *)((long)(trie->data).ptr0 + (long)iVar3 * 2);
      if ((stopAtCompBoundary != '\0') &&
         (UVar2 = norm16HasCompBoundaryBefore(this,norm16), UVar2 != '\0')) {
        return src;
      }
      UVar2 = decompose(this,c,norm16,buffer,errorCode);
      if (UVar2 == '\0') goto LAB_001a142a;
      src = pUVar4;
    } while ((stopAtCompBoundary == '\0') ||
            (UVar2 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous), UVar2 == '\0'));
  }
  else {
LAB_001a142a:
    pUVar4 = (UChar *)0x0;
  }
  return pUVar4;
}

Assistant:

const UChar *
Normalizer2Impl::decomposeShort(const UChar *src, const UChar *limit,
                                UBool stopAtCompBoundary, UBool onlyContiguous,
                                ReorderingBuffer &buffer, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    while(src<limit) {
        if (stopAtCompBoundary && *src < minCompNoMaybeCP) {
            return src;
        }
        const UChar *prevSrc = src;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, src, limit, c, norm16);
        if (stopAtCompBoundary && norm16HasCompBoundaryBefore(norm16)) {
            return prevSrc;
        }
        if(!decompose(c, norm16, buffer, errorCode)) {
            return nullptr;
        }
        if (stopAtCompBoundary && norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return src;
        }
    }
    return src;
}